

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

String * String::number(String *__return_storage_ptr__,double num,size_t prec)

{
  int iVar1;
  size_t w;
  char buf [32];
  char format [32];
  size_t prec_local;
  double num_local;
  
  snprintf(buf + 0x18,0x20,"%%.%uf",prec & 0xffffffff);
  iVar1 = snprintf((char *)&w,0x20,buf + 0x18,num);
  String(__return_storage_ptr__,(char *)&w,(long)iVar1);
  return __return_storage_ptr__;
}

Assistant:

static String number(double num, size_t prec = 2)
    {
        char format[32];

        // cast to unsigned because windows doesn't have %z format specifier
        snprintf(format, sizeof(format), "%%.%uf", (unsigned)prec);
        char buf[32];
        const size_t w = ::snprintf(buf, sizeof(buf), format, num);
        return String(buf, w);
    }